

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# User.h
# Opt level: O0

void __thiscall User::User(User *this,User *other)

{
  User *other_local;
  User *this_local;
  
  std::__cxx11::string::string((string *)&this->username);
  std::__cxx11::string::string((string *)&this->alias);
  std::__cxx11::string::string((string *)&this->bio);
  std::__cxx11::string::string((string *)&this->password);
  this->id = other->id;
  std::__cxx11::string::operator=((string *)&this->username,(string *)&other->username);
  std::__cxx11::string::operator=((string *)&this->alias,(string *)&other->alias);
  std::__cxx11::string::operator=((string *)&this->bio,(string *)&other->bio);
  std::__cxx11::string::operator=((string *)&this->password,(string *)&other->password);
  return;
}

Assistant:

User(const User& other)
  {
	  this->id = other.id;
	  this->username = other.username;
	  this->alias = other.alias;
	  this->bio = other.bio;
	  this->password = other.password;
  }